

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

void cleanup_slay(void)

{
  ulong uVar1;
  long lVar2;
  
  if (z_info->slay_max != '\0') {
    lVar2 = 0;
    uVar1 = 0;
    do {
      string_free(*(char **)((long)&slays->code + lVar2));
      string_free(*(char **)((long)&slays->name + lVar2));
      string_free(*(char **)((long)&slays->base + lVar2));
      string_free(*(char **)((long)&slays->melee_verb + lVar2));
      string_free(*(char **)((long)&slays->range_verb + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar1 < z_info->slay_max);
  }
  mem_free(slays);
  return;
}

Assistant:

static void cleanup_slay(void)
{
	int idx;
	for (idx = 0; idx < z_info->slay_max; idx++) {
		string_free(slays[idx].code);
		string_free(slays[idx].name);
		string_free(slays[idx].base);
		string_free(slays[idx].melee_verb);
		string_free(slays[idx].range_verb);
	}
	mem_free(slays);
}